

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

void __thiscall
Js::HeapArgumentsObject::ExtractSnapObjectDataInto_Helper<(TTD::NSSnapObjects::SnapObjectType)13>
          (HeapArgumentsObject *this,SnapObject *objData,SlabAllocator *alloc)

{
  bool bVar1;
  BOOLEAN BVar2;
  SnapHeapArgumentsInfo *addtlInfo;
  ActivationObject **ppAVar3;
  BVSparse<Memory::Recycler> **ppBVar4;
  BVSparse<Memory::Recycler> *this_00;
  byte *local_50;
  uint local_3c;
  unsigned_long *puStack_38;
  uint32 i;
  TTD_PTR_ID *depOnArray;
  uint32 depOnCount;
  SnapHeapArgumentsInfo *argsInfo;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  HeapArgumentsObject *this_local;
  
  addtlInfo = TTD::SlabAllocatorBase<0>::
              SlabAllocateStruct<TTD::NSSnapObjects::SnapHeapArgumentsInfo>(alloc);
  if (-1 < *(int *)&this->field_0x20) {
    addtlInfo->NumOfArguments = *(uint *)&this->field_0x20 & 0x7fffffff;
    addtlInfo->FormalCount = this->formalCount;
    depOnArray._4_4_ = 0;
    puStack_38 = (unsigned_long *)0x0;
    addtlInfo->IsFrameNullPtr = false;
    addtlInfo->FrameObject = 0;
    ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObject__
                        ((WriteBarrierPtr *)&this->frameObject);
    if (*ppAVar3 == (ActivationObject *)0x0) {
      addtlInfo->IsFrameNullPtr = true;
    }
    else {
      ppAVar3 = Memory::PointerValue<Js::ActivationObject>(&this->frameObject);
      addtlInfo->FrameObject = (TTD_PTR_ID)*ppAVar3;
      ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObject__
                          ((WriteBarrierPtr *)&this->frameObject);
      bVar1 = TTD::JsSupport::IsVarComplexKind(*ppAVar3);
      if (bVar1) {
        puStack_38 = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,1);
        *puStack_38 = addtlInfo->FrameObject;
      }
      depOnArray._4_4_ = (uint32)bVar1;
    }
    if (this->formalCount == 0) {
      local_50 = (byte *)0x0;
    }
    else {
      local_50 = TTD::SlabAllocatorBase<0>::SlabAllocateArrayZ<unsigned_char>
                           (alloc,(ulong)addtlInfo->FormalCount);
    }
    addtlInfo->DeletedArgFlags = local_50;
    ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparse__
                        ((WriteBarrierPtr *)&this->deletedArgs);
    if (*ppBVar4 != (BVSparse<Memory::Recycler> *)0x0) {
      for (local_3c = 0; local_3c < this->formalCount; local_3c = local_3c + 1) {
        this_00 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->
                            (&this->deletedArgs);
        BVar2 = BVSparse<Memory::Recycler>::Test(this_00,local_3c);
        if (BVar2 != '\0') {
          addtlInfo->DeletedArgFlags[local_3c] = '\x01';
        }
      }
    }
    if (depOnArray._4_4_ == 0) {
      TTD::NSSnapObjects::
      StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
                (objData,addtlInfo);
    }
    else {
      TTD::NSSnapObjects::
      StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
                (objData,addtlInfo,alloc,depOnArray._4_4_,puStack_38);
    }
    return;
  }
  TTDAbort_unrecoverable_error("This never seems to be set but I want to assert just to be safe.");
}

Assistant:

void HeapArgumentsObject::ExtractSnapObjectDataInto_Helper(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapHeapArgumentsInfo* argsInfo = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapHeapArgumentsInfo>();

        TTDAssert(this->callerDeleted == 0, "This never seems to be set but I want to assert just to be safe.");
        argsInfo->NumOfArguments = this->numOfArguments;
        argsInfo->FormalCount = this->formalCount;

        uint32 depOnCount = 0;
        TTD_PTR_ID* depOnArray = nullptr;

        argsInfo->IsFrameNullPtr = false;
        argsInfo->FrameObject = TTD_INVALID_PTR_ID;
        if(this->frameObject == nullptr)
        {
            argsInfo->IsFrameNullPtr = true;
        }
        else
        {
            argsInfo->FrameObject = TTD_CONVERT_VAR_TO_PTR_ID(this->frameObject);

            //Primitive kinds always inflated first so we only need to deal with complex kinds as depends on
            if(TTD::JsSupport::IsVarComplexKind(this->frameObject))
            {
                depOnCount = 1;
                depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);
                depOnArray[0] = argsInfo->FrameObject;
            }
        }

        argsInfo->DeletedArgFlags = (this->formalCount != 0) ? alloc.SlabAllocateArrayZ<byte>(argsInfo->FormalCount) : nullptr;
        if(this->deletedArgs != nullptr)
        {
            for(uint32 i = 0; i < this->formalCount; ++i)
            {
                if(this->deletedArgs->Test(i))
                {
                    argsInfo->DeletedArgFlags[i] = true;
                }
            }
        }

        if(depOnCount == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*, argsKind>(objData, argsInfo);
        }
        else
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*, argsKind>(objData, argsInfo, alloc, depOnCount, depOnArray);
        }
    }